

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitRefCast(PrintExpressionContents *this,RefCast *curr)

{
  string_view str;
  
  str._M_str = "ref.cast ";
  str._M_len = 9;
  printMedium(this->o,str);
  printType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression.
                       type.id);
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    printMedium(o, "ref.cast ");
    printType(curr->type);
  }